

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 *puVar1;
  long *plVar2;
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  *extraout_RDX;
  ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  *pIVar3;
  undefined4 in_register_00000034;
  long lVar4;
  Connection *pCVar5;
  Disposer *pDVar6;
  Own<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>_>
  OVar7;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>
  local_28;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  if ((*(short *)(lVar4 + 0x18) == 0) && (*(char *)(lVar4 + 0x120) == '\0')) {
    *(undefined1 *)(lVar4 + 0x120) = 1;
    local_28.disposer = (Disposer *)(lVar4 + 0x160);
    *(int *)(lVar4 + 0x178) = *(int *)(lVar4 + 0x178) + 1;
    local_28.ptr = (Connection *)(lVar4 + 8);
    OVar7 = kj::
            heap<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>,kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
                      ((kj *)&local_48,&local_28);
    pCVar5 = local_28.ptr;
    pIVar3 = OVar7.ptr;
    *(undefined4 *)&(this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         local_48;
    *(undefined4 *)
     ((long)&(this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase + 4) =
         uStack_44;
    *(undefined4 *)&(this->super_Connection).super_Connection._vptr_Connection =
         (undefined4)uStack_40;
    *(undefined4 *)((long)&(this->super_Connection).super_Connection._vptr_Connection + 4) =
         uStack_40._4_4_;
    if (local_28.ptr == (Connection *)0x0) goto LAB_003cbb00;
    local_28.ptr = (Connection *)0x0;
    pDVar6 = local_28.disposer;
  }
  else {
    kj::
    newPromiseAndFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
              ();
    puVar1 = *(undefined8 **)(lVar4 + 0x140);
    plVar2 = *(long **)(lVar4 + 0x148);
    *(undefined4 *)(lVar4 + 0x140) = local_38;
    *(undefined4 *)(lVar4 + 0x144) = uStack_34;
    *(undefined4 *)(lVar4 + 0x148) = (undefined4)uStack_30;
    *(undefined4 *)(lVar4 + 0x14c) = uStack_30._4_4_;
    uStack_30 = (long *)0x0;
    if (plVar2 == (long *)0x0) {
      (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
           (_func_int **)CONCAT44(uStack_44,local_48);
      (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)uStack_40;
      goto LAB_003cbb00;
    }
    (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    plVar2 = uStack_30;
    *(undefined4 *)&(this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         local_48;
    *(undefined4 *)
     ((long)&(this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase + 4) =
         uStack_44;
    *(undefined4 *)&(this->super_Connection).super_Connection._vptr_Connection =
         (undefined4)uStack_40;
    *(undefined4 *)((long)&(this->super_Connection).super_Connection._vptr_Connection + 4) =
         uStack_40._4_4_;
    uStack_40 = (Connection *)0x0;
    if (uStack_30 == (long *)0x0) goto LAB_003cbb00;
    uStack_30 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_34,local_38))
              ((undefined8 *)CONCAT44(uStack_34,local_38),(long)plVar2 + *(long *)(*plVar2 + -0x10))
    ;
    pCVar5 = uStack_40;
    if (uStack_40 == (Connection *)0x0) goto LAB_003cbb00;
    uStack_40 = (Connection *)0x0;
    pIVar3 = extraout_RDX;
    pDVar6 = (Disposer *)CONCAT44(uStack_44,local_48);
  }
  (**pDVar6->_vptr_Disposer)
            (pDVar6,(pCVar5->super_Connection)._vptr_Connection[-2] +
                    (long)&(pCVar5->super_Connection)._vptr_Connection,pIVar3);
LAB_003cbb00:
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}